

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O1

void __thiscall irr::gui::CGUIListBox::draw(CGUIListBox *this)

{
  IGUISpriteBank *pIVar1;
  pointer pLVar2;
  IGUIFont *pIVar3;
  char cVar4;
  s32 size;
  int iVar5;
  undefined4 uVar6;
  u32 uVar7;
  uint uVar8;
  long *plVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  _func_int **pp_Var14;
  ulong uVar15;
  undefined8 *puVar16;
  rect<int> frameRect;
  rect<int> textRect;
  rect<int> clientClip;
  rect<int> *other;
  byte local_a0;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  string<wchar_t> local_80;
  uint local_5c;
  int local_58;
  int iStack_54;
  undefined8 uStack_50;
  rect<int> local_48;
  
  if (this->field_0xa0 == '\x01') {
    recalculateItemHeight(this);
    plVar9 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    size = (**(code **)(*plVar9 + 0x10))(plVar9,0);
    updateScrollBarSize(this,size);
    local_98 = *(undefined8 *)&this->field_0x40;
    uStack_90 = *(ulong *)&this->field_0x48;
    local_48.LowerRightCorner.X = *(int *)&this->field_0x48;
    local_48.LowerRightCorner.Y = *(int *)&this->field_0x4c;
    local_48.UpperLeftCorner.X = (int)*(undefined8 *)&this->field_0x40 + 1;
    local_48.UpperLeftCorner.Y = (int)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20) + 1;
    iVar5 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xd])()
    ;
    if ((char)iVar5 != '\0') {
      local_48.LowerRightCorner.X =
           local_48.LowerRightCorner.X +
           ((this->ScrollBar->super_IGUIElement).RelativeRect.UpperLeftCorner.X -
           (this->ScrollBar->super_IGUIElement).RelativeRect.LowerRightCorner.X);
    }
    local_48.LowerRightCorner.Y = local_48.LowerRightCorner.Y + -1;
    other = (rect<int> *)&this->field_0x50;
    core::rect<int>::clipAgainst(&local_48,other);
    uVar6 = (**(code **)*plVar9)(plVar9,3);
    (**(code **)(*plVar9 + 0x70))(plVar9,this,uVar6,1,this->DrawBack,&local_98,other);
    uStack_90 = *(ulong *)&this->field_0x48;
    local_98._0_4_ = (int)*(undefined8 *)&this->field_0x40;
    local_98._0_4_ = (int)local_98 + 1;
    local_98._4_4_ = (int)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20);
    iVar5 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0xd])()
    ;
    if ((char)iVar5 != '\0') {
      uStack_90 = (ulong)(uint)((int)uStack_90 +
                               ((this->ScrollBar->super_IGUIElement).RelativeRect.UpperLeftCorner.X
                               - (this->ScrollBar->super_IGUIElement).RelativeRect.LowerRightCorner.
                                 X));
    }
    uStack_90._4_4_ = this->ItemHeight + *(int *)&this->field_0x44;
    iVar5 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
                      ();
    local_98._4_4_ = local_98._4_4_ - iVar5;
    iVar5 = (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])
                      ();
    uStack_90 = CONCAT44(uStack_90._4_4_ - iVar5,(int)uStack_90);
    if (this->HighlightWhenNotFocused == false) {
      local_a0 = 0;
      cVar4 = (**(code **)(**(long **)&this->field_0x128 + 0x28))
                        (*(long **)&this->field_0x128,this,0);
      if (cVar4 == '\0') {
        local_a0 = (**(code **)(**(long **)&this->field_0x128 + 0x28))
                             (*(long **)&this->field_0x128,this->ScrollBar,0);
        local_a0 = local_a0 ^ 1;
      }
    }
    else {
      local_a0 = 0;
    }
    if (0 < (int)((ulong)((long)(this->Items).m_data.
                                super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->Items).m_data.
                               super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
      lVar12 = 0;
      uVar15 = 0;
      do {
        if ((*(int *)&this->field_0x44 <= uStack_90._4_4_) &&
           (local_98._4_4_ <= *(int *)&this->field_0x4c)) {
          if (uVar15 == (uint)this->Selected && local_a0 == 0) {
            uVar6 = (**(code **)*plVar9)(plVar9,10);
            local_80.str._M_dataplus._M_p._0_4_ = uVar6;
            (**(code **)(*plVar9 + 0xa8))(plVar9,this,&local_80,&local_98,&local_48);
          }
          uVar6 = (undefined4)((ulong)other >> 0x20);
          uStack_50 = uStack_90;
          uVar11 = uStack_50;
          _local_58 = CONCAT44(local_98._4_4_,(int)local_98 + 3);
          if (this->Font != (IGUIFont *)0x0) {
            pIVar1 = this->IconBank;
            if ((pIVar1 != (IGUISpriteBank *)0x0) &&
               (pLVar2 = (this->Items).m_data.
                         super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               -1 < *(int *)((long)(pLVar2->OverrideColors + -1) + lVar12 + 4))) {
              uStack_50._4_4_ = (int)(uStack_90 >> 0x20);
              local_80.str._M_dataplus._M_p =
                   (pointer)CONCAT44(local_98._4_4_ + (uStack_50._4_4_ - local_98._4_4_) / 2,
                                     (int)local_98 + 3 + this->ItemsIconWidth / 2);
              local_5c = *(uint *)((long)(pLVar2->OverrideColors + -1) + lVar12 + 4);
              uStack_50 = uVar11;
              if (uVar15 == (uint)this->Selected && local_a0 == 0) {
                cVar4 = (**(code **)(*(long *)this + 0x1b0))(this,uVar15 & 0xffffffff,3);
                if (cVar4 == '\0') {
                  local_9c = (**(code **)(*(long *)this + 0x1c0))(this,3);
                }
                else {
                  local_9c = (**(code **)(*(long *)this + 0x1b8))(this,uVar15 & 0xffffffff,3);
                }
                uVar8 = this->selectTime;
                uVar7 = os::Timer::getTime();
                pp_Var14 = pIVar1->_vptr_IGUISpriteBank;
                uVar11 = CONCAT44(uVar6,uVar7);
                uVar13 = (ulong)uVar8;
              }
              else {
                cVar4 = (**(code **)(*(long *)this + 0x1b0))(this,uVar15 & 0xffffffff,2);
                if (cVar4 == '\0') {
                  local_9c = (**(code **)(*(long *)this + 0x1c0))(this,2);
                }
                else {
                  local_9c = (**(code **)(*(long *)this + 0x1b8))(this,uVar15 & 0xffffffff,2);
                }
                uVar7 = 0;
                if (uVar15 == (uint)this->Selected) {
                  uVar7 = os::Timer::getTime();
                }
                pp_Var14 = pIVar1->_vptr_IGUISpriteBank;
                uVar11 = CONCAT44(uVar6,uVar7);
                uVar13 = 0;
              }
              (*pp_Var14[8])(pIVar1,(ulong)local_5c,&local_80,&local_48,&local_9c,uVar13,uVar11,0,1)
              ;
            }
            other = &local_48;
            _local_58 = CONCAT44(iStack_54,this->ItemsIconWidth + local_58 + 3);
            pIVar3 = this->Font;
            if (uVar15 == (uint)this->Selected && local_a0 == 0) {
              local_80.str._M_dataplus._M_p = (pointer)&local_80.str.field_2;
              local_80.str._M_string_length = 0;
              local_80.str.field_2._M_local_buf[0] = L'\0';
              core::string<wchar_t>::operator=
                        (&local_80,
                         *(wchar_t **)
                          ((long)((this->Items).m_data.
                                  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->OverrideColors +
                          lVar12 + -0x24));
              cVar4 = (**(code **)(*(long *)this + 0x1b0))(this,uVar15 & 0xffffffff,1);
              lVar10 = *(long *)this;
              if (cVar4 != '\0') {
                uVar11 = 1;
                goto LAB_002228c8;
              }
              uVar11 = 1;
LAB_002228d9:
              uVar8 = (**(code **)(lVar10 + 0x1c0))(this,uVar11);
            }
            else {
              local_80.str._M_dataplus._M_p = (pointer)&local_80.str.field_2;
              local_80.str._M_string_length = 0;
              local_80.str.field_2._M_local_buf[0] = L'\0';
              core::string<wchar_t>::operator=
                        (&local_80,
                         *(wchar_t **)
                          ((long)((this->Items).m_data.
                                  super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->OverrideColors +
                          lVar12 + -0x24));
              cVar4 = (**(code **)(*(long *)this + 0x1b0))(this,uVar15 & 0xffffffff,0);
              lVar10 = *(long *)this;
              if (cVar4 == '\0') {
                uVar11 = 0;
                goto LAB_002228d9;
              }
              uVar11 = 0;
LAB_002228c8:
              uVar8 = (**(code **)(lVar10 + 0x1b8))(this,uVar15 & 0xffffffff,uVar11);
            }
            (**pIVar3->_vptr_IGUIFont)(pIVar3,&local_80,&local_58,(ulong)uVar8,0,1,other);
            if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                 *)local_80.str._M_dataplus._M_p != &local_80.str.field_2) {
              operator_delete(local_80.str._M_dataplus._M_p,
                              CONCAT44(local_80.str.field_2._M_local_buf[1],
                                       local_80.str.field_2._M_local_buf[0]) * 4 + 4);
            }
            _local_58 = CONCAT44(iStack_54,(local_58 - this->ItemsIconWidth) + -3);
          }
        }
        local_98._4_4_ = local_98._4_4_ + this->ItemHeight;
        uStack_90 = CONCAT44(uStack_90._4_4_ + this->ItemHeight,(int)uStack_90);
        uVar15 = uVar15 + 1;
        lVar12 = lVar12 + 0x48;
      } while ((long)uVar15 <
               (long)((int)((ulong)((long)(this->Items).m_data.
                                          super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->Items).m_data.
                                         super__Vector_base<irr::gui::CGUIListBox::ListItem,_std::allocator<irr::gui::CGUIListBox::ListItem>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x38e38e39));
    }
    cVar4 = (**(code **)(*(long *)this + 0x68))(this);
    if (cVar4 != '\0') {
      for (puVar16 = *(undefined8 **)&this->field_0x8; puVar16 != (undefined8 *)&this->field_0x8;
          puVar16 = (undefined8 *)*puVar16) {
        (**(code **)(*(long *)puVar16[2] + 0x50))();
      }
    }
  }
  return;
}

Assistant:

void CGUIListBox::draw()
{
	if (!IsVisible)
		return;

	recalculateItemHeight(); // if the font changed

	IGUISkin *skin = Environment->getSkin();
	updateScrollBarSize(skin->getSize(EGDS_SCROLLBAR_SIZE));

	core::rect<s32> *clipRect = 0;

	// draw background
	core::rect<s32> frameRect(AbsoluteRect);

	// draw items

	core::rect<s32> clientClip(AbsoluteRect);
	clientClip.UpperLeftCorner.Y += 1;
	clientClip.UpperLeftCorner.X += 1;
	if (ScrollBar->isVisible())
		clientClip.LowerRightCorner.X -= ScrollBar->getRelativePosition().getWidth();
	clientClip.LowerRightCorner.Y -= 1;
	clientClip.clipAgainst(AbsoluteClippingRect);

	skin->draw3DSunkenPane(this, skin->getColor(EGDC_3D_HIGH_LIGHT), true,
			DrawBack, frameRect, &AbsoluteClippingRect);

	if (clipRect)
		clientClip.clipAgainst(*clipRect);

	frameRect = AbsoluteRect;
	frameRect.UpperLeftCorner.X += 1;
	if (ScrollBar->isVisible())
		frameRect.LowerRightCorner.X -= ScrollBar->getRelativePosition().getWidth();

	frameRect.LowerRightCorner.Y = AbsoluteRect.UpperLeftCorner.Y + ItemHeight;

	frameRect.UpperLeftCorner.Y -= ScrollBar->getPos();
	frameRect.LowerRightCorner.Y -= ScrollBar->getPos();

	bool hl = (HighlightWhenNotFocused || Environment->hasFocus(this) || Environment->hasFocus(ScrollBar));

	for (s32 i = 0; i < (s32)Items.size(); ++i) {
		if (frameRect.LowerRightCorner.Y >= AbsoluteRect.UpperLeftCorner.Y &&
				frameRect.UpperLeftCorner.Y <= AbsoluteRect.LowerRightCorner.Y) {
			if (i == Selected && hl)
				skin->draw2DRectangle(this, skin->getColor(EGDC_HIGH_LIGHT), frameRect, &clientClip);

			core::rect<s32> textRect = frameRect;
			textRect.UpperLeftCorner.X += 3;

			if (Font) {
				if (IconBank && (Items[i].Icon > -1)) {
					core::position2di iconPos = textRect.UpperLeftCorner;
					iconPos.Y += textRect.getHeight() / 2;
					iconPos.X += ItemsIconWidth / 2;

					if (i == Selected && hl) {
						IconBank->draw2DSprite((u32)Items[i].Icon, iconPos, &clientClip,
								hasItemOverrideColor(i, EGUI_LBC_ICON_HIGHLIGHT) ? getItemOverrideColor(i, EGUI_LBC_ICON_HIGHLIGHT) : getItemDefaultColor(EGUI_LBC_ICON_HIGHLIGHT),
								selectTime, os::Timer::getTime(), false, true);
					} else {
						IconBank->draw2DSprite((u32)Items[i].Icon, iconPos, &clientClip,
								hasItemOverrideColor(i, EGUI_LBC_ICON) ? getItemOverrideColor(i, EGUI_LBC_ICON) : getItemDefaultColor(EGUI_LBC_ICON),
								0, (i == Selected) ? os::Timer::getTime() : 0, false, true);
					}
				}

				textRect.UpperLeftCorner.X += ItemsIconWidth + 3;

				if (i == Selected && hl) {
					Font->draw(Items[i].Text.c_str(), textRect,
							hasItemOverrideColor(i, EGUI_LBC_TEXT_HIGHLIGHT) ? getItemOverrideColor(i, EGUI_LBC_TEXT_HIGHLIGHT) : getItemDefaultColor(EGUI_LBC_TEXT_HIGHLIGHT),
							false, true, &clientClip);
				} else {
					Font->draw(Items[i].Text.c_str(), textRect,
							hasItemOverrideColor(i, EGUI_LBC_TEXT) ? getItemOverrideColor(i, EGUI_LBC_TEXT) : getItemDefaultColor(EGUI_LBC_TEXT),
							false, true, &clientClip);
				}

				textRect.UpperLeftCorner.X -= ItemsIconWidth + 3;
			}
		}

		frameRect.UpperLeftCorner.Y += ItemHeight;
		frameRect.LowerRightCorner.Y += ItemHeight;
	}

	IGUIElement::draw();
}